

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mf.cc
# Opt level: O2

base_learner * mf_setup(options_i *options,vw *all)

{
  int iVar1;
  base_learner *l;
  single_learner *base;
  learner<mf,_example> *plVar2;
  free_ptr<mf> data;
  option_group_definition new_options;
  allocator local_16a;
  allocator local_169;
  free_ptr<mf> local_168;
  string local_158 [32];
  string local_138;
  string local_118;
  option_group_definition local_f8;
  undefined1 local_c0 [112];
  bool local_50;
  
  scoped_calloc_or_throw<mf>();
  std::__cxx11::string::string
            ((string *)&local_118,"Matrix Factorization Reduction",(allocator *)local_c0);
  VW::config::option_group_definition::option_group_definition(&local_f8,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_138,"new_mf",&local_169);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_c0,&local_138,
             &(local_168._M_t.super___uniq_ptr_impl<mf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_mf_*,_void_(*)(void_*)>.super__Head_base<0UL,_mf_*,_false>.
              _M_head_impl)->rank);
  local_50 = true;
  std::__cxx11::string::string(local_158,"rank for reduction-based matrix factorization",&local_16a)
  ;
  std::__cxx11::string::_M_assign((string *)(local_c0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<unsigned_long>&>
            (&local_f8,(typed_option<unsigned_long> *)local_c0);
  std::__cxx11::string::~string(local_158);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_c0);
  std::__cxx11::string::~string((string *)&local_138);
  (**options->_vptr_options_i)(options,&local_f8);
  std::__cxx11::string::string((string *)local_c0,"new_mf",(allocator *)local_158);
  iVar1 = (*options->_vptr_options_i[1])(options,local_c0);
  std::__cxx11::string::~string((string *)local_c0);
  if ((char)iVar1 == '\0') {
    plVar2 = (learner<mf,_example> *)0x0;
  }
  else {
    (local_168._M_t.super___uniq_ptr_impl<mf,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_mf_*,_void_(*)(void_*)>.super__Head_base<0UL,_mf_*,_false>._M_head_impl)
    ->all = all;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&(local_168._M_t.super___uniq_ptr_impl<mf,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_mf_*,_void_(*)(void_*)>.super__Head_base<0UL,_mf_*,_false>.
                 _M_head_impl)->pairs,&all->pairs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&all->pairs);
    all->random_positive_weights = true;
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar2 = LEARNER::init_learner<mf,example,LEARNER::learner<char,example>>
                       (&local_168,base,learn,predict<false>,
                        (local_168._M_t.super___uniq_ptr_impl<mf,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_mf_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_mf_*,_false>._M_head_impl)->rank * 2 + 1);
    *(undefined8 *)(plVar2 + 0xb8) = *(undefined8 *)(plVar2 + 0x18);
    *(undefined8 *)(plVar2 + 0xc0) = *(undefined8 *)(plVar2 + 0x20);
    *(code **)(plVar2 + 200) = finish;
  }
  VW::config::option_group_definition::~option_group_definition(&local_f8);
  std::unique_ptr<mf,_void_(*)(void_*)>::~unique_ptr(&local_168);
  return (base_learner *)plVar2;
}

Assistant:

base_learner* mf_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<mf>();
  option_group_definition new_options("Matrix Factorization Reduction");
  new_options.add(make_option("new_mf", data->rank).keep().help("rank for reduction-based matrix factorization"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("new_mf"))
    return nullptr;

  data->all = &all;
  // store global pairs in local data structure and clear global pairs
  // for eventual calls to base learner
  data->pairs = all.pairs;
  all.pairs.clear();

  all.random_positive_weights = true;

  learner<mf, example>& l =
      init_learner(data, as_singleline(setup_base(options, all)), learn, predict<false>, 2 * data->rank + 1);
  l.set_finish(finish);
  return make_base(l);
}